

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cow_guarded.hpp
# Opt level: O2

void __thiscall
gmlc::libguarded::
cow_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
::cow_guarded<>(cow_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::mutex>
                *this)

{
  shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  
  std::make_shared<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  lr_guarded<std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,std::mutex>
  ::
  lr_guarded<std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((lr_guarded<std::shared_ptr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const>,std::mutex>
              *)this,&local_20);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_20.
              super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  *(undefined8 *)((long)&(this->m_writeMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_writeMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_writeMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_writeMutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_writeMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  return;
}

Assistant:

cow_guarded<T, M>::cow_guarded(Us&&... data):
    m_data(std::make_shared<T>(std::forward<Us>(data)...))
{
}